

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable arkodeSymplecticCandyRozmus4(void)

{
  double dVar1;
  double dVar2;
  ARKodeSPRKTable sprk_table;
  int in_stack_ffffffffffffffdc;
  ARKodeSPRKTable local_8;
  
  local_8 = ARKodeSPRKTable_Alloc(in_stack_ffffffffffffffdc);
  if (local_8 == (ARKodeSPRKTable)0x0) {
    local_8 = (ARKodeSPRKTable)0x0;
  }
  else {
    local_8->q = 4;
    local_8->stages = 4;
    dVar1 = pow(2.0,0.3333333333333333);
    dVar2 = pow(2.0,-0.3333333333333333);
    *local_8->a = (dVar1 + 2.0 + dVar2) / 6.0;
    dVar1 = pow(2.0,0.3333333333333333);
    dVar2 = pow(2.0,-0.3333333333333333);
    local_8->a[1] = ((1.0 - dVar1) - dVar2) / 6.0;
    local_8->a[2] = local_8->a[1];
    local_8->a[3] = *local_8->a;
    *local_8->ahat = 0.0;
    dVar1 = pow(2.0,0.3333333333333333);
    local_8->ahat[1] = 1.0 / (2.0 - dVar1);
    dVar1 = pow(2.0,0.6666666666666666);
    local_8->ahat[2] = 1.0 / (1.0 - dVar1);
    local_8->ahat[3] = local_8->ahat[1];
  }
  return local_8;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticCandyRozmus4(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(4);
  if (!sprk_table) { return NULL; }
  sprk_table->q      = 4;
  sprk_table->stages = 4;
  sprk_table->a[0] =
    (SUN_RCONST(2.0) +
     SUNRpowerR(SUN_RCONST(2.0), SUN_RCONST(1.0) / SUN_RCONST(3.0)) +
     SUNRpowerR(SUN_RCONST(2.0), -SUN_RCONST(1.0) / SUN_RCONST(3.0))) /
    SUN_RCONST(6.0);
  sprk_table->a[1] =
    (SUN_RCONST(1.0) -
     SUNRpowerR(SUN_RCONST(2.0), SUN_RCONST(1.0) / SUN_RCONST(3.0)) -
     SUNRpowerR(SUN_RCONST(2.0), -SUN_RCONST(1.0) / SUN_RCONST(3.0))) /
    SUN_RCONST(6.0);
  sprk_table->a[2]    = sprk_table->a[1];
  sprk_table->a[3]    = sprk_table->a[0];
  sprk_table->ahat[0] = SUN_RCONST(0.0);
  sprk_table->ahat[1] =
    SUN_RCONST(1.0) /
    (SUN_RCONST(2.0) -
     SUNRpowerR(SUN_RCONST(2.0), SUN_RCONST(1.0) / SUN_RCONST(3.0)));
  sprk_table->ahat[2] =
    SUN_RCONST(1.0) /
    (SUN_RCONST(1.0) -
     SUNRpowerR(SUN_RCONST(2.0), SUN_RCONST(2.0) / SUN_RCONST(3.0)));
  sprk_table->ahat[3] = sprk_table->ahat[1];
  return sprk_table;
}